

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<kj::HttpInputStream::Message> * __thiscall
kj::_::ExceptionOr<kj::HttpInputStream::Message>::operator=
          (ExceptionOr<kj::HttpInputStream::Message> *this,
          ExceptionOr<kj::HttpInputStream::Message> *param_1)

{
  ExceptionOr<kj::HttpInputStream::Message> *param_1_local;
  ExceptionOr<kj::HttpInputStream::Message> *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<kj::HttpInputStream::Message>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;